

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_fluent.cpp
# Opt level: O0

Appendable * __thiscall
icu_63::number::FormattedNumber::appendTo
          (FormattedNumber *this,Appendable *appendable,UErrorCode *status)

{
  UBool UVar1;
  uint uVar2;
  char16_t *pcVar3;
  UErrorCode *status_local;
  Appendable *appendable_local;
  FormattedNumber *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    if (this->fResults == (UFormattedNumberData *)0x0) {
      *status = this->fErrorCode;
    }
    else {
      pcVar3 = impl::NumberStringBuilder::chars(&this->fResults->string);
      uVar2 = impl::NumberStringBuilder::length(&this->fResults->string);
      (*(appendable->super_UObject)._vptr_UObject[5])(appendable,pcVar3,(ulong)uVar2);
    }
  }
  return appendable;
}

Assistant:

Appendable& FormattedNumber::appendTo(Appendable& appendable, UErrorCode& status) const {
    if (U_FAILURE(status)) {
        return appendable;
    }
    if (fResults == nullptr) {
        status = fErrorCode;
        return appendable;
    }
    appendable.appendString(fResults->string.chars(), fResults->string.length());
    return appendable;
}